

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

unique_ptr<vm::VM,_std::default_delete<vm::VM>_> __thiscall vm::VM::make_vm(VM *this,File *file)

{
  ushort uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar3;
  InvalidFile *pIVar4;
  pointer pVVar5;
  unique_ptr<int[],_std::default_delete<int[]>_> local_100;
  unique_ptr<int[],_std::default_delete<int[]>_> local_f8;
  undefined1 local_f0 [8];
  __single_object vm;
  string local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  value_type local_98;
  value_type local_8c;
  reference local_80;
  value_type *constant;
  allocator<char> local_61;
  string local_60;
  reference local_40;
  Function *fun;
  iterator __end1;
  iterator __begin1;
  vector<vm::Function,_std::allocator<vm::Function>_> *__range1;
  bool mainFound;
  u4 mainIndex;
  File *file_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<vm::Function,_std::allocator<vm::Function>_>::begin(&file->functions);
  fun = (Function *)std::vector<vm::Function,_std::allocator<vm::Function>_>::end(&file->functions);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
                                *)&fun);
    if (!bVar2) {
LAB_0013366f:
      sVar3 = std::vector<vm::Function,_std::allocator<vm::Function>_>::size(&file->functions);
      if (__range1._4_4_ == sVar3) {
        vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
        super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
        super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl._6_1_ = 1;
        pIVar4 = (InvalidFile *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"main not found",
                   (allocator<char> *)
                   ((long)&vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
                           super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
                           super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl + 7));
        InvalidFile::InvalidFile(pIVar4,&local_e0);
        vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
        super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
        super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl._6_1_ = 0;
        __cxa_throw(pIVar4,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      std::make_unique<vm::VM,File>((File *)local_f0);
      std::make_unique<int[]>((size_t)&local_f8);
      pVVar5 = std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::operator->
                         ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_f0);
      std::unique_ptr<int[],_std::default_delete<int[]>_>::operator=(&pVVar5->_stack,&local_f8);
      std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&local_f8);
      std::make_unique<int[]>((size_t)&local_100);
      pVVar5 = std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::operator->
                         ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_f0);
      std::unique_ptr<int[],_std::default_delete<int[]>_>::operator=(&pVVar5->_heap,&local_100);
      std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&local_100);
      std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::unique_ptr
                ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)this,
                 (unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_f0);
      std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
                ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_f0);
      return (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)
             (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)this;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>
               ::operator*(&__end1);
    uVar1 = local_40->nameIndex;
    sVar3 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::size(&file->constants);
    if (sVar3 <= uVar1) {
      constant._3_1_ = 1;
      pIVar4 = (InvalidFile *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"function name index out of range",&local_61);
      InvalidFile::InvalidFile(pIVar4,&local_60);
      constant._3_1_ = 0;
      __cxa_throw(pIVar4,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    local_80 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at
                         (&file->constants,(ulong)local_40->nameIndex);
    if (local_80->type != STRING) {
      local_ba = 1;
      pIVar4 = (InvalidFile *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"function name not found",&local_b9);
      InvalidFile::InvalidFile(pIVar4,&local_b8);
      local_ba = 0;
      __cxa_throw(pIVar4,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    __lhs = std::get<std::__cxx11::string,std::__cxx11::string,int,double>(&local_80->value);
    bVar2 = std::operator==(__lhs,"main");
    if (bVar2) {
      local_8c.op = snew;
      local_8c.x = (u4)local_40->paramSize;
      local_8c.y = 0;
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::push_back
                (&file->start,&local_8c);
      local_98.op = call;
      local_98.x = __range1._4_4_;
      local_98.y = 0;
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::push_back
                (&file->start,&local_98);
      goto LAB_0013366f;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<vm::Function_*,_std::vector<vm::Function,_std::allocator<vm::Function>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

std::unique_ptr<VM> VM::make_vm(File file) {
    // found main function
    vm::u4 mainIndex = 0;
    bool mainFound = false;
    for (auto& fun : file.functions) {
        if (0 > fun.nameIndex || fun.nameIndex >= file.constants.size()) {
            throw InvalidFile("function name index out of range");
        }
        if (auto& constant = file.constants.at(fun.nameIndex); constant.type == vm::Constant::Type::STRING) {
            if (std::get<vm::str_t>(constant.value) == "main") {
                file.start.push_back(Instruction{OpCode::snew, fun.paramSize});
                file.start.push_back(Instruction{OpCode::call, mainIndex});
                break;
            }
        }
        else {
            throw InvalidFile("function name not found");
        }
        ++mainIndex;
    }
    if (mainIndex == file.functions.size()) {
        throw InvalidFile("main not found");
    }
    auto vm = std::make_unique<VM>(std::move(file));
    vm->_stack = std::make_unique<slot_t[]>(MAX_STACK_ADDR-MIN_STACK_ADDR);
    vm->_heap  = std::make_unique<slot_t[]>(MAX_HEAP_ADDR-MIN_HEAP_ADDR);
    return std::move(vm);
}